

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  basic_ofstream<char,_std::char_traits<char>_> *stream;
  pointer pbVar8;
  string *psVar9;
  long *plVar10;
  char *pcVar11;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_title;
  undefined8 *puVar13;
  pointer pbVar14;
  string ext_name;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  output_streams;
  string error_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dds_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ktx_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvr_files;
  string file_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  column_titles;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e8;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  ImplV2 IStack_3c8;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_3c0;
  string local_3a8;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  undefined8 uStack_2b0;
  uint32_t local_2a8 [28];
  undefined1 local_238 [520];
  
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  if (argc != 0) {
    if (argc == 1) {
      PrintHelp();
      goto LAB_0012b129;
    }
    uVar12 = 1;
    do {
      pcVar11 = argv[uVar12];
      iVar4 = strcmp(pcVar11,"/?");
      if (((iVar4 == 0) || (iVar4 = strcmp(pcVar11,"-h"), iVar4 == 0)) ||
         (iVar4 = strcmp(pcVar11,"--help"), iVar4 == 0)) {
        PrintHelp();
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)ParameterInfo_abi_cxx11_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      if (iVar4 == 0) {
        _ZL12s_parameters_0 = '\x01';
      }
      else {
        std::__cxx11::string::string((string *)local_2d0,argv[uVar12],(allocator *)local_238);
        std::__cxx11::string::string
                  ((string *)local_2f0,(char *)local_2d0._0_8_,(allocator *)&local_388);
        local_3f8._0_8_ = local_3f8 + 0x10;
        local_3f8._8_8_ = 0;
        aStack_3e8._M_allocated_capacity = aStack_3e8._M_allocated_capacity & 0xffffffffffffff00;
        lVar5 = std::__cxx11::string::rfind((char)(string *)local_2f0,0x2e);
        if (lVar5 != -1) {
          std::__cxx11::string::substr((ulong)local_238,(ulong)local_2f0);
          std::__cxx11::string::operator=((string *)local_3f8,(string *)local_238);
          if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_);
          }
        }
        if (local_2f0[0] != local_2e0) {
          operator_delete(local_2f0[0]);
        }
        iVar4 = std::__cxx11::string::compare(local_3f8);
        this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_328;
        if (iVar4 == 0) {
LAB_0012a935:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2d0);
        }
        else {
          iVar4 = std::__cxx11::string::compare(local_3f8);
          this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_348;
          if (iVar4 == 0) goto LAB_0012a935;
          iVar4 = std::__cxx11::string::compare(local_3f8);
          this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368;
          if (iVar4 == 0) goto LAB_0012a935;
        }
        if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
          operator_delete((void *)local_3f8._0_8_);
        }
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector(&local_3c0,DAT_00143588 - Defaults::kCsvNames_abi_cxx11_ >> 5,(allocator_type *)local_238
          );
  if ((_ZL12s_parameters_0 == '\x01') &&
     (local_3c0.
      super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_3c0.
      super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    uVar12 = 0;
    do {
      if ((ulong)(DAT_00143588 - Defaults::kCsvNames_abi_cxx11_ >> 5) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
        goto LAB_0012b194;
      }
      puVar13 = (undefined8 *)(Defaults::kCsvNames_abi_cxx11_ + uVar12 * 0x20);
      psVar9 = (string *)
               (local_3c0.
                super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar12 * 0x200);
      std::ofstream::open(psVar9,(_Ios_Openmode)puVar13);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        printf("ERROR: Unable to open %s",*puVar13);
      }
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = (pointer)0x0;
      if (3 < (uint)uVar12) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/joedavisdev[P]textureinfo/main.cpp"
                      ,0x94,"int main(int, char **)");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(&PTR_column_names_abi_cxx11__00142d90)[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar9,"File name",9);
      local_2d0[0] = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar9,local_2d0,1);
      uVar7 = local_238._8_8_;
      for (pbVar14 = (pointer)local_238._0_8_; pbVar14 != (pointer)uVar7; pbVar14 = pbVar14 + 1) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)psVar9,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length)
        ;
        local_2d0[0] = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2d0,1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)psVar9 + -0x18) + (char)psVar9);
      std::ostream::put((char)psVar9);
      std::ostream::flush();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238);
      uVar12 = (ulong)((uint)uVar12 + 1);
    } while (uVar12 < (ulong)((long)local_3c0.
                                    super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_3c0.
                                    super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 9));
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  pbVar14 = local_328.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ifstream::ifstream((ifstream *)local_238,(string *)pbVar8,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar8->_M_dataplus)._M_p);
      }
      else {
        local_2d0._0_8_ = &PTR_LoadHeader_00142c90;
        local_2a8[0] = 0;
        local_2a8[1] = 0;
        local_2a8[2] = 0;
        local_2a8[3] = 0;
        aStack_2c0._8_8_ = 0;
        uStack_2b0._0_4_ = 0;
        uStack_2b0._4_4_ = 0;
        local_2d0._8_8_ = 0;
        aStack_2c0._M_allocated_capacity = 0;
        local_3f8._0_8_ = &PTR_LoadHeader_00142ce0;
        local_3d0._0_4_ = 0;
        local_3d0._4_4_ = 0;
        IStack_3c8.magic_number = 0;
        IStack_3c8.num_surfaces = 0;
        aStack_3e8._8_4_ = 0;
        aStack_3e8._12_4_ = 0;
        uStack_3d8._0_4_ = 0;
        uStack_3d8._4_4_ = 0;
        local_3f8._8_8_ = 0;
        aStack_3e8._M_allocated_capacity = 0;
        bVar2 = PvrV3Header::LoadHeader((PvrV3Header *)local_2d0,(ifstream *)local_238,&local_388);
        plVar10 = (long *)local_2d0;
        if ((bVar2) ||
           (bVar3 = PvrLegacyHeader::LoadHeader
                              ((PvrLegacyHeader *)local_3f8,(ifstream *)local_238,&local_388),
           plVar10 = (long *)local_3f8, bVar3)) {
          if (_ZL12s_parameters_0 == '\x01') {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)
                                (local_3c0.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (ulong)!bVar2 * 0x200),
                                (pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
            (**(code **)(*plVar10 + 0x10))(&local_3a8,plVar10);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            pcVar11 = "PVR (legacy)";
            if (bVar2) {
              pcVar11 = "PVR (v3)";
            }
            local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a8,pcVar11,pcVar11 + (ulong)!bVar2 * 4 + 8);
            (**(code **)(*plVar10 + 8))(&local_310,plVar10);
            PrintHeaderInfo(pbVar8,&local_3a8,&local_310);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p);
          }
        }
        else {
          printf("ERROR: %s - %s\n",(pbVar8->_M_dataplus)._M_p,local_388._M_dataplus._M_p);
        }
      }
      std::ifstream::~ifstream((ifstream *)local_238);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar14);
  }
  pbVar14 = local_348.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_348.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ifstream::ifstream((ifstream *)local_238,(string *)pbVar8,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar8->_M_dataplus)._M_p);
      }
      else {
        local_2d0._0_8_ = &PTR_LoadHeader_00142d20;
        local_2a8[0] = 0;
        local_2a8[1] = 0;
        local_2a8[2] = 0;
        local_2a8[3] = 0;
        aStack_2c0._8_8_ = 0;
        uStack_2b0._0_4_ = 0;
        uStack_2b0._4_4_ = 0;
        local_2d0._8_8_ = 0;
        aStack_2c0._M_allocated_capacity = 0;
        local_2a8[4] = 0;
        bVar2 = KTXHeader::LoadHeader((KTXHeader *)local_2d0,(ifstream *)local_238,&local_388);
        lVar5 = Defaults::kContainerNames_abi_cxx11_;
        if (bVar2) {
          if (_ZL12s_parameters_0 == '\x01') {
            if ((ulong)((long)local_3c0.
                              super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c0.
                              super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 9) < 3)
            goto LAB_0012b194;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)
                                (local_3c0.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x400),
                                (pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
            KTXHeader::ToCsvString_abi_cxx11_((string *)local_3f8,(KTXHeader *)local_2d0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_3f8._0_8_,local_3f8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            if ((ulong)(DAT_00143570 - Defaults::kContainerNames_abi_cxx11_ >> 5) < 3)
            goto LAB_0012b194;
            KTXHeader::ToString_abi_cxx11_((string *)local_3f8,(KTXHeader *)local_2d0);
            PrintHeaderInfo(pbVar8,(string *)(lVar5 + 0x40),(string *)local_3f8);
          }
          if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
            operator_delete((void *)local_3f8._0_8_);
          }
        }
        else {
          printf("ERROR: %s - %s\n",(pbVar8->_M_dataplus)._M_p,local_388._M_dataplus._M_p);
        }
      }
      std::ifstream::~ifstream((ifstream *)local_238);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar14);
  }
  pbVar14 = local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_368.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ifstream::ifstream((ifstream *)local_238,(string *)pbVar8,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar8->_M_dataplus)._M_p);
      }
      else {
        local_2d0._0_8_ = &PTR_LoadHeader_00142d60;
        bVar2 = DDSHeader::LoadHeader((DDSHeader *)local_2d0,(ifstream *)local_238,&local_388);
        lVar5 = Defaults::kContainerNames_abi_cxx11_;
        if (bVar2) {
          if (_ZL12s_parameters_0 == '\x01') {
            if ((ulong)((long)local_3c0.
                              super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c0.
                              super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 9) < 4)
            goto LAB_0012b1a7;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)
                                (local_3c0.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x600),
                                (pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
            DDSHeader::ToCsvString_abi_cxx11_((string *)local_3f8,(DDSHeader *)local_2d0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_3f8._0_8_,local_3f8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            if ((ulong)(DAT_00143570 - Defaults::kContainerNames_abi_cxx11_ >> 5) < 4)
            goto LAB_0012b1a7;
            DDSHeader::ToString_abi_cxx11_((string *)local_3f8,(DDSHeader *)local_2d0);
            PrintHeaderInfo(pbVar8,(string *)(lVar5 + 0x60),(string *)local_3f8);
          }
          if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
            operator_delete((void *)local_3f8._0_8_);
          }
        }
        else {
          printf("ERROR: %s - %s\n",(pbVar8->_M_dataplus)._M_p,local_388._M_dataplus._M_p);
        }
      }
      std::ifstream::~ifstream((ifstream *)local_238);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar14);
  }
  for (; local_3c0.
         super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_3c0.
         super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_3c0.
      super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_3c0.
           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 0x200) {
    std::ofstream::close();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_3c0);
LAB_0012b129:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  return 0;
LAB_0012b194:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_0012b1a7:
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  _Unwind_Resume(uVar7);
}

Assistant:

int main (int argc, char *argv[]) {
  std::vector<std::string> pvr_files, ktx_files, dds_files;
  //*-------------------------------
  // Loop through args
  //-------------------------------*/
  if(argc == 1) {
    PrintHelp();
    return 0;
  }
  for(unsigned int index = 1; index < argc; index++) {
    // Flags
    if(strcmp(argv[index], "/?") == 0 ||
    strcmp(argv[index], "-h") == 0 ||
    strcmp(argv[index], "--help") == 0) {
      PrintHelp();
    }
    if(argv[index] == std::get<0>(ParameterInfo[0])) {
      s_parameters.print_csv = true;
      continue;
    }
    // Files
    std::string file_name(argv[index]);
    std::string ext_name(GetFilenameExt(file_name.c_str()));
    if(ext_name == "pvr") {
      pvr_files.push_back(std::move(file_name));
    }
    else if(ext_name == "ktx") {
      ktx_files.push_back(std::move(file_name));
    }
    else if(ext_name == "dds") {
      dds_files.push_back(std::move(file_name));
    }
  }
  //*-------------------------------
  // CSV setup
  //-------------------------------*/
  std::vector<std::ofstream> output_streams(Defaults::kCsvNames.size());
  if(s_parameters.print_csv) {
    for(unsigned int index = 0; index < output_streams.size(); ++index) {
      const std::string& output_name(Defaults::kCsvNames.at(index));
      std::ofstream& output(output_streams.at(index));
      output.open(output_name);
      if(!output.is_open()) {
        printf("ERROR: Unable to open %s", output_name.c_str());
      }
      std::vector<std::string> column_titles;
      switch (index) {
        case Defaults::Types::PVRV3:
          column_titles = PvrV3Info::column_names;
          break;
        case Defaults::Types::PVRLegacy:
          column_titles = PvrLegacyInfo::column_names;
          break;
        case Defaults::Types::KTX:
          column_titles = KTXInfo::column_names;
          break;
          case Defaults::Types::DDS:
          column_titles = DDSInfo::column_names;
          break;
        default:
          assert(0);
          break;
      }
      output << "File name" << ',';
      for(auto& column_title : column_titles)
        output << column_title << ',';
      output << std::endl;
    }
  }
  //*-------------------------------
  // Load files & print
  //-------------------------------*/
  std::string error_string("");
  // PVR files
  for(const auto& file_name: pvr_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    unsigned int file_type(Defaults::Types::PVRV3);
    IHeader* header(nullptr);
    PvrV3Header pvr_header;
    PvrLegacyHeader pvr_legacy_header;
    // PVR v3
    if(pvr_header.LoadHeader(file, error_string)) header = &pvr_header;
    else file_type = Defaults::Types::PVRLegacy;
    // Legacy container
    if(header == nullptr) {
      if(pvr_legacy_header.LoadHeader(file, error_string)) {
        header = &pvr_legacy_header;
      }
      else {
        printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
      }
    }
    // Print
    if(s_parameters.print_csv)
      output_streams[file_type] << file_name << "," << header->ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        file_type == Defaults::Types::PVRV3?"PVR (v3)":"PVR (legacy)",
        header->ToString());
  }
  // KTX files
  for(const auto& file_name: ktx_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    KTXHeader ktx_header;
    if(!ktx_header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::KTX) << file_name << "," << ktx_header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::KTX),
        ktx_header.ToString());
  }
  // DDS files
  for(const auto& file_name: dds_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    DDSHeader header;
    if(!header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::DDS) << file_name << "," << header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::DDS),
        header.ToString());
  }
  
  // Shutdown
  for(auto& stream:output_streams)
    stream.close();
}